

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entcode.c
# Opt level: O2

uint32_t od_ec_tell_frac(uint32_t nbits_total,uint32_t rng)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = 0;
  for (iVar3 = -3; iVar3 != 0; iVar3 = iVar3 + 1) {
    uVar1 = rng * rng;
    uVar2 = uVar2 << 1 | uVar1 >> 0x1f;
    rng = (uVar1 >> 0xf) >> (byte)(uVar1 >> 0x1f);
  }
  return nbits_total * 8 - uVar2;
}

Assistant:

uint32_t od_ec_tell_frac(uint32_t nbits_total, uint32_t rng) {
  uint32_t nbits;
  int l;
  int i;
  /*To handle the non-integral number of bits still left in the encoder/decoder
     state, we compute the worst-case number of bits of val that must be
     encoded to ensure that the value is inside the range for any possible
     subsequent bits.
    The computation here is independent of val itself (the decoder does not
     even track that value), even though the real number of bits used after
     od_ec_enc_done() may be 1 smaller if rng is a power of two and the
     corresponding trailing bits of val are all zeros.
    If we did try to track that special case, then coding a value with a
     probability of 1/(1 << n) might sometimes appear to use more than n bits.
    This may help explain the surprising result that a newly initialized
     encoder or decoder claims to have used 1 bit.*/
  nbits = nbits_total << OD_BITRES;
  l = 0;
  for (i = OD_BITRES; i-- > 0;) {
    int b;
    rng = rng * rng >> 15;
    b = (int)(rng >> 16);
    l = l << 1 | b;
    rng >>= b;
  }
  return nbits - l;
}